

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O0

bool __thiscall Js::JavascriptFunction::HasRestrictedProperties(JavascriptFunction *this)

{
  bool bVar1;
  uint uVar2;
  BOOL BVar3;
  FunctionInfo *pFVar4;
  JavascriptLibrary *this_00;
  JavascriptFunction *pJVar5;
  bool local_11;
  JavascriptFunction *this_local;
  
  pFVar4 = Memory::WriteBarrierPtr<Js::FunctionInfo>::operator->(&this->functionInfo);
  bVar1 = FunctionInfo::IsClassMethod(pFVar4);
  local_11 = true;
  if (!bVar1) {
    pFVar4 = Memory::WriteBarrierPtr<Js::FunctionInfo>::operator->(&this->functionInfo);
    bVar1 = FunctionInfo::IsClassConstructor(pFVar4);
    local_11 = true;
    if (!bVar1) {
      pFVar4 = Memory::WriteBarrierPtr<Js::FunctionInfo>::operator->(&this->functionInfo);
      bVar1 = FunctionInfo::IsMethod(pFVar4);
      local_11 = true;
      if (!bVar1) {
        pFVar4 = Memory::WriteBarrierPtr<Js::FunctionInfo>::operator->(&this->functionInfo);
        bVar1 = FunctionInfo::IsLambda(pFVar4);
        local_11 = true;
        if (!bVar1) {
          pFVar4 = Memory::WriteBarrierPtr<Js::FunctionInfo>::operator->(&this->functionInfo);
          bVar1 = FunctionInfo::IsAsync(pFVar4);
          local_11 = true;
          if (!bVar1) {
            uVar2 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])();
            local_11 = true;
            if ((uVar2 & 1) == 0) {
              BVar3 = IsStrictMode(this);
              local_11 = true;
              if (BVar3 == 0) {
                BVar3 = IsScriptFunction(this);
                local_11 = true;
                if (BVar3 != 0) {
                  bVar1 = IsLibraryCode(this);
                  local_11 = true;
                  if (!bVar1) {
                    this_00 = RecyclableObject::GetLibrary((RecyclableObject *)this);
                    pJVar5 = (JavascriptFunction *)
                             JavascriptLibraryBase::GetFunctionPrototype
                                       (&this_00->super_JavascriptLibraryBase);
                    local_11 = this == pJVar5;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (bool)((local_11 ^ 0xffU) & 1);
}

Assistant:

bool JavascriptFunction::HasRestrictedProperties() const
    {
        return !(
            this->functionInfo->IsClassMethod() ||
            this->functionInfo->IsClassConstructor() ||
            this->functionInfo->IsMethod() ||
            this->functionInfo->IsLambda() ||
            this->functionInfo->IsAsync() ||
            this->IsGeneratorFunction() ||
            this->IsStrictMode() ||
            !this->IsScriptFunction() || // -> (BoundFunction || RuntimeFunction) // (RuntimeFunction = Native-defined built-in library functions)
            this->IsLibraryCode() || // JS-defined built-in library functions
            this == this->GetLibrary()->GetFunctionPrototype() // the intrinsic %FunctionPrototype% (original value of Function.prototype)
            );
    }